

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  StringRef rhs;
  StringRef lhs;
  StringRef passOrFail;
  ostream *poVar2;
  int iVar3;
  size_type sVar4;
  Code colour;
  char *pcVar5;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  undefined1 auStack_88 [15];
  Colour colourGuard;
  AssertionPrinter printer;
  SourceLineInfo local_40 [2];
  
  iVar3 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  printer.printInfoMessages = true;
  if (((char)iVar3 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (printer.printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  printer.stream = (this->super_StreamingReporterBase).stream;
  printer.result = &_assertionStats->assertionResult;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&printer.messages,&_assertionStats->infoMessages);
  printer.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  colourGuard.m_moved = false;
  colour = FileName;
  Colour::use(FileName);
  poVar2 = printer.stream;
  local_40[0].file = ((printer.result)->m_info).lineInfo.file;
  local_40[0].line = ((printer.result)->m_info).lineInfo.line;
  Catch::operator<<(printer.stream,local_40);
  std::operator<<(poVar2,':');
  Colour::~Colour(&colourGuard);
  printer.itMessage._M_current =
       printer.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = ((printer.result)->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    passOrFail_04.m_size = 6;
    passOrFail_04.m_start = "passed";
    anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightGreen,passOrFail_04);
    anon_unknown_23::AssertionPrinter::printOriginalExpression(&printer);
    anon_unknown_23::AssertionPrinter::printReconstructedExpression(&printer);
    colour = FileName;
    if (((printer.result)->m_info).capturedExpression.m_size == 0) {
      colour = None;
    }
    goto LAB_00145abb;
  case Info:
    sVar4 = 4;
    pcVar5 = "info";
    break;
  case Warning:
    sVar4 = 7;
    pcVar5 = "warning";
    break;
  case Unknown:
switchD_00145920_caseD_ffffffff:
    passOrFail_01.m_size = 0x14;
    passOrFail_01.m_start = "** internal error **";
    anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_01);
    goto LAB_00145ac7;
  default:
    if (OVar1 == FailureBit) goto switchD_00145920_caseD_ffffffff;
    if (OVar1 == ExpressionFailed) {
      if ((((printer.result)->m_info).resultDisposition & SuppressFail) == 0) {
        passOrFail_07.m_size = 6;
        passOrFail_07.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_07);
      }
      else {
        lhs.m_size = (size_type)printer.result;
        lhs.m_start = (char *)printer.stream;
        rhs.m_size._7_1_ = colourGuard.m_moved;
        rhs._0_15_ = auStack_88;
        operator+[abi_cxx11_(lhs,rhs);
        passOrFail.m_size = local_40[0].line;
        passOrFail.m_start = local_40[0].file;
        anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightGreen,passOrFail);
        std::__cxx11::string::~string((string *)local_40);
      }
      anon_unknown_23::AssertionPrinter::printOriginalExpression(&printer);
      anon_unknown_23::AssertionPrinter::printReconstructedExpression(&printer);
    }
    else if (OVar1 == ExplicitFailure) {
      passOrFail_02.m_size = 6;
      passOrFail_02.m_start = "failed";
      anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_02);
      colour = None;
      anon_unknown_23::AssertionPrinter::printIssue(&printer,"explicitly");
    }
    else {
      if (OVar1 == Exception) goto switchD_00145920_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        passOrFail_05.m_size = 6;
        passOrFail_05.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_05);
        pcVar5 = "unexpected exception with message:";
LAB_001459fe:
        anon_unknown_23::AssertionPrinter::printIssue(&printer,pcVar5);
        anon_unknown_23::AssertionPrinter::printMessage(&printer);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) goto LAB_00145ac7;
          passOrFail_00.m_size = 6;
          passOrFail_00.m_start = "failed";
          anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_00);
          pcVar5 = "fatal error condition with message:";
          goto LAB_001459fe;
        }
        passOrFail_06.m_size = 6;
        passOrFail_06.m_start = "failed";
        anon_unknown_23::AssertionPrinter::printResultType(&printer,BrightRed,passOrFail_06);
        anon_unknown_23::AssertionPrinter::printIssue(&printer,"expected exception, got none");
      }
      anon_unknown_23::AssertionPrinter::printExpressionWas(&printer);
    }
    goto LAB_00145abb;
  }
  passOrFail_03.m_size = sVar4;
  passOrFail_03.m_start = pcVar5;
  anon_unknown_23::AssertionPrinter::printResultType(&printer,None,passOrFail_03);
  anon_unknown_23::AssertionPrinter::printMessage(&printer);
LAB_00145abb:
  anon_unknown_23::AssertionPrinter::printRemainingMessages(&printer,colour);
LAB_00145ac7:
  std::endl<char,std::char_traits<char>>((this->super_StreamingReporterBase).stream);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&printer.messages);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded(AssertionStats const &_assertionStats) {
        AssertionResult const &result = _assertionStats.assertionResult;

        bool printInfoMessages = true;

        // Drop out if result was successful and we're not printing those
        if (!m_config->includeSuccessfulResults() && result.isOk()) {
            if (result.getResultType() != ResultWas::Warning)
                return false;
            printInfoMessages = false;
        }

        AssertionPrinter printer(stream, _assertionStats, printInfoMessages);
        printer.print();

        stream << std::endl;
        return true;
    }